

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_frame.c
# Opt level: O1

void nghttp2_frame_priority_update_init
               (nghttp2_extension *frame,int32_t stream_id,uint8_t *field_value,
               size_t field_value_len)

{
  int32_t *piVar1;
  
  (frame->hd).length = field_value_len + 4;
  (frame->hd).type = '\x10';
  (frame->hd).flags = '\0';
  (frame->hd).stream_id = 0;
  (frame->hd).reserved = '\0';
  piVar1 = (int32_t *)frame->payload;
  *piVar1 = stream_id;
  *(uint8_t **)(piVar1 + 2) = field_value;
  *(size_t *)(piVar1 + 4) = field_value_len;
  return;
}

Assistant:

void nghttp2_frame_priority_update_init(nghttp2_extension *frame,
                                        int32_t stream_id, uint8_t *field_value,
                                        size_t field_value_len) {
  nghttp2_ext_priority_update *priority_update;

  nghttp2_frame_hd_init(&frame->hd, 4 + field_value_len,
                        NGHTTP2_PRIORITY_UPDATE, NGHTTP2_FLAG_NONE, 0);

  priority_update = frame->payload;
  priority_update->stream_id = stream_id;
  priority_update->field_value = field_value;
  priority_update->field_value_len = field_value_len;
}